

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

int __thiscall icu_63::PluralFormat::init(PluralFormat *this,EVP_PKEY_CTX *ctx)

{
  UErrorCode *status;
  int in_EAX;
  int iVar1;
  undefined4 extraout_var;
  PluralRules *pPVar2;
  NumberFormat *pNVar3;
  int in_ECX;
  undefined4 in_register_0000000c;
  void *in_RDX;
  void *in_R8;
  
  if (0 < *(int *)CONCAT44(in_register_0000000c,in_ECX)) {
    return in_EAX;
  }
  status = (UErrorCode *)CONCAT44(in_register_0000000c,in_ECX);
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    pPVar2 = PluralRules::forLocale(&this->locale,(UPluralType)in_RDX,status);
    (this->pluralRulesWrapper).pluralRules = pPVar2;
  }
  else {
    iVar1 = PluralRules::clone((PluralRules *)ctx,(__fn *)ctx,in_RDX,in_ECX,in_R8);
    (this->pluralRulesWrapper).pluralRules = (PluralRules *)CONCAT44(extraout_var,iVar1);
    if ((PluralRules *)CONCAT44(extraout_var,iVar1) == (PluralRules *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      pNVar3 = (NumberFormat *)0x0;
      goto LAB_00282a59;
    }
  }
  pNVar3 = NumberFormat::createInstance(&this->locale,status);
  this->numberFormat = pNVar3;
LAB_00282a59:
  return (int)pNVar3;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }